

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::LE_Fire_PDU::SetLocationFlag(LE_Fire_PDU *this,KBOOL F)

{
  if ((((this->m_FireFlagUnion).m_ui8Flag & 0x40) == 0) == F) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xbf | F << 6;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 0x10 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 8
    ;
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetLocationFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8Location )return;

    m_FireFlagUnion.m_ui8Location = F;

    if( F )
    {
        m_ui16PDULength += RelativeWorldCoordinates::RELATVE_WORLD_COORDINATES_SIZE;
    }
    else
    {
        m_ui16PDULength -= RelativeWorldCoordinates::RELATVE_WORLD_COORDINATES_SIZE;
    }
}